

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

ScriptOperator *
cfd::core::ScriptOperator::Get(ScriptOperator *__return_storage_ptr__,string *message)

{
  pointer pcVar1;
  size_t __n;
  uint __val;
  uint uVar2;
  int iVar3;
  uint uVar4;
  iterator iVar5;
  CfdException *this;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  uint __len;
  bool bVar9;
  string num_str;
  string search_text;
  string opcode_text;
  undefined1 local_90 [32];
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + message->_M_string_length);
  iVar3 = ::std::__cxx11::string::compare((char *)message);
  if (iVar3 == 0) {
    pcVar7 = "0";
  }
  else {
    iVar3 = ::std::__cxx11::string::compare((char *)message);
    if (iVar3 != 0) {
      if (3 < message->_M_string_length) {
        ::std::__cxx11::string::substr((ulong)local_90,(ulong)message);
        uVar4 = atoi((char *)local_90._0_8_);
        if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
          operator_delete((void *)local_90._0_8_);
        }
        __val = -uVar4;
        if (0 < (int)uVar4) {
          __val = uVar4;
        }
        __len = 1;
        if (9 < __val) {
          uVar8 = (ulong)__val;
          uVar2 = 4;
          do {
            __len = uVar2;
            uVar6 = (uint)uVar8;
            if (uVar6 < 100) {
              __len = __len - 2;
              goto LAB_0030716b;
            }
            if (uVar6 < 1000) {
              __len = __len - 1;
              goto LAB_0030716b;
            }
            if (uVar6 < 10000) goto LAB_0030716b;
            uVar8 = uVar8 / 10000;
            uVar2 = __len + 4;
          } while (99999 < uVar6);
          __len = __len + 1;
        }
LAB_0030716b:
        local_90._0_8_ = local_90 + 0x10;
        ::std::__cxx11::string::_M_construct
                  ((ulong)local_90,(char)__len - (char)((int)uVar4 >> 0x1f));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)(local_90._0_8_ + (ulong)(uVar4 >> 0x1f)),__len,__val);
        ::std::operator+(&local_50,"OP_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90);
        __n = message->_M_string_length;
        if (__n == local_50._M_string_length) {
          if (__n == 0) {
            bVar9 = true;
          }
          else {
            iVar3 = bcmp((message->_M_dataplus)._M_p,local_50._M_dataplus._M_p,__n);
            bVar9 = iVar3 == 0;
          }
          if ((bool)(uVar4 - 1 < 0x10 & bVar9)) {
            ::std::__cxx11::string::_M_assign((string *)&local_70);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
          operator_delete((void *)local_90._0_8_);
        }
      }
      goto LAB_003070f4;
    }
    pcVar7 = "-1";
  }
  ::std::__cxx11::string::_M_replace
            ((ulong)&local_70,0,(char *)local_70._M_string_length,(ulong)pcVar7);
LAB_003070f4:
  iVar5 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
                  *)g_operator_text_map_abi_cxx11_,&local_70);
  if (iVar5._M_node != (_Base_ptr)(g_operator_text_map_abi_cxx11_ + 8)) {
    __return_storage_ptr__->_vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00722da0;
    __return_storage_ptr__->data_type_ = *(ScriptType *)&iVar5._M_node[2]._M_parent;
    (__return_storage_ptr__->text_data_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->text_data_).field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->text_data_,iVar5._M_node[2]._M_left,
               (long)&(iVar5._M_node[2]._M_left)->_M_color +
               (long)&(iVar5._M_node[2]._M_right)->_M_color);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  local_90._0_8_ = "cfdcore_script.cpp";
  local_90._8_4_ = 0x1d3;
  local_90._16_8_ = "Get";
  logger::log<>((CfdSourceLocation *)local_90,kCfdLogLevelWarning,"target op_code not found.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_90._0_8_ = local_90 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"target op_code not found.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_90);
  *(undefined ***)this = &PTR__CfdException_0072e710;
  __cxa_throw(this,&InvalidScriptException::typeinfo,CfdException::~CfdException);
}

Assistant:

ScriptOperator ScriptOperator::Get(const std::string& message) {
  std::string search_text = message;
  if (message == "OP_0") {
    search_text = "0";
  } else if (message == "OP_1NEGATE") {
    search_text = "-1";
  } else if (message.length() >= 4) {
    int num = std::atoi(message.substr(3).c_str());
    std::string num_str = std::to_string(num);
    std::string opcode_text = "OP_" + num_str;
    if ((message == opcode_text) && (num >= 1) && (num <= 16)) {
      search_text = num_str;
    }
  }
  decltype(g_operator_text_map)::const_iterator ite =
      g_operator_text_map.find(search_text);
  if (ite == g_operator_text_map.end()) {
    warn(CFD_LOG_SOURCE, "target op_code not found.");
    throw InvalidScriptException("target op_code not found.");
  }
  return ite->second;
}